

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O0

BN_MONT_CTX * BN_MONT_CTX_new(void)

{
  int in_EDX;
  char *in_RSI;
  BN_MONT_CTX *ret;
  BN_MONT_CTX *local_8;
  
  local_8 = (BN_MONT_CTX *)CRYPTO_malloc(0x68,in_RSI,in_EDX);
  if (local_8 == (BN_MONT_CTX *)0x0) {
    local_8 = (BN_MONT_CTX *)0x0;
  }
  else {
    BN_MONT_CTX_init(local_8);
    local_8->flags = 1;
  }
  return local_8;
}

Assistant:

BN_MONT_CTX *BN_MONT_CTX_new(void)
{
    BN_MONT_CTX *ret;

    if ((ret = CRYPTO_malloc(sizeof(*ret))) == NULL)
        return (NULL);

    BN_MONT_CTX_init(ret);
    ret->flags = BN_FLG_MALLOCED;
    return (ret);
}